

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O1

void __thiscall
glcts::ArraysOfArrays::ExpressionsDynamicIndexing1<glcts::ArraysOfArrays::Interface::ES>::
test_shader_compilation
          (ExpressionsDynamicIndexing1<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type)

{
  ulong *puVar1;
  long lVar2;
  TestError *pTVar3;
  string *psVar4;
  long lVar5;
  undefined1 *puVar6;
  long *plVar7;
  string expression_type_declarations;
  string shader_source;
  string expressions [4];
  long *local_100 [2];
  long local_f0 [2];
  long local_e0;
  undefined1 *local_d8;
  undefined8 local_d0;
  undefined1 local_c8;
  undefined7 uStack_c7;
  ulong uStack_c0;
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  long *local_58 [2];
  long local_48 [3];
  
  local_100[0] = local_f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_100,"uniform int a;\nconst int b = 0;\nint c = 0;\nfloat x[2][2];\n",""
            );
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"a","");
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"b","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"c","");
  plVar7 = local_48;
  local_58[0] = plVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"0 + 1","");
  local_d8 = &local_c8;
  local_d0 = 0;
  local_c8 = 0;
  lVar2 = 0;
  do {
    lVar5 = 8;
    local_e0 = lVar2;
    do {
      std::__cxx11::string::_M_assign((string *)&local_d8);
      std::__cxx11::string::_M_append((char *)&local_d8,shader_start_abi_cxx11_);
      std::__cxx11::string::append((char *)&local_d8);
      std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_b8[lVar2 * 4]);
      std::__cxx11::string::append((char *)&local_d8);
      std::__cxx11::string::_M_append((char *)&local_d8,*(ulong *)((long)&uStack_c0 + lVar5));
      std::__cxx11::string::append((char *)&local_d8);
      puVar1 = &set_tesseation_abi_cxx11_;
      switch(tested_shader_type) {
      case FRAGMENT_SHADER_TYPE:
      case COMPUTE_SHADER_TYPE:
      case TESSELATION_EVALUATION_SHADER_TYPE:
        break;
      case VERTEX_SHADER_TYPE:
        std::__cxx11::string::append((char *)&local_d8);
        break;
      case GEOMETRY_SHADER_TYPE:
        puVar1 = &emit_quad_abi_cxx11_;
      case TESSELATION_CONTROL_SHADER_TYPE:
        std::__cxx11::string::_M_append((char *)&local_d8,*puVar1);
        break;
      default:
        pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar3,"Unrecognized shader type.",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                   ,0xd1b);
        __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      std::__cxx11::string::_M_append((char *)&local_d8,shader_end_abi_cxx11_);
      puVar6 = empty_string_abi_cxx11_;
      psVar4 = (string *)empty_string_abi_cxx11_;
      switch(tested_shader_type) {
      case FRAGMENT_SHADER_TYPE:
        puVar6 = default_vertex_shader_source_abi_cxx11_;
        psVar4 = (string *)&local_d8;
        break;
      case VERTEX_SHADER_TYPE:
        puVar6 = (string *)&local_d8;
        goto LAB_00b4580c;
      case COMPUTE_SHADER_TYPE:
        break;
      case GEOMETRY_SHADER_TYPE:
      case TESSELATION_CONTROL_SHADER_TYPE:
      case TESSELATION_EVALUATION_SHADER_TYPE:
        puVar6 = default_vertex_shader_source_abi_cxx11_;
LAB_00b4580c:
        psVar4 = (string *)default_fragment_shader_source_abi_cxx11_;
        break;
      default:
        pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar3,"Invalid enum",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                   ,0xd1e);
        __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.
        super_TestNode._vptr_TestNode[9])(this,puVar6,psVar4,1,0);
      lVar5 = lVar5 + 0x20;
    } while (lVar5 != 0x88);
    lVar2 = local_e0 + 1;
    if (lVar2 == 4) {
      if (local_d8 != &local_c8) {
        operator_delete(local_d8,CONCAT71(uStack_c7,local_c8) + 1);
      }
      lVar2 = -0x80;
      do {
        if (plVar7 != (long *)plVar7[-2]) {
          operator_delete((long *)plVar7[-2],*plVar7 + 1);
        }
        plVar7 = plVar7 + -4;
        lVar2 = lVar2 + 0x20;
      } while (lVar2 != 0);
      if (local_100[0] != local_f0) {
        operator_delete(local_100[0],local_f0[0] + 1);
      }
      return;
    }
  } while( true );
}

Assistant:

void ExpressionsDynamicIndexing1<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string expression_type_declarations = "uniform int a;\n"
											   "const int b = 0;\n"
											   "int c = 0;\n"
											   "float x[2][2];\n";

	std::string expressions[] = { "a", "b", "c", "0 + 1" };
	std::string shader_source;

	for (size_t write_index = 0; write_index < sizeof(expressions) / sizeof(expressions[0]); write_index++)
	{
		for (size_t read_index = 0; read_index < sizeof(expressions) / sizeof(expressions[0]); read_index++)
		{
			shader_source = expression_type_declarations;
			shader_source += shader_start;
			shader_source += "    x[";
			shader_source += expressions[write_index];
			shader_source += "][";
			shader_source += expressions[read_index];
			shader_source += "] = 1.0;\n\n";

			/* End main */
			DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

			/* Execute test */
			EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
		} /* for (int read_index = 0; ...) */
	}	 /* for (int write_index = 0; ...) */
}